

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::RegexpFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  FunctionNullHandling in_stack_fffffffffffffc38;
  allocator_type local_3c1;
  scalar_function_t local_3b8;
  scalar_function_t local_398;
  LogicalType local_378;
  vector<duckdb::LogicalType,_true> local_360;
  LogicalType local_348;
  vector<duckdb::LogicalType,_true> local_330;
  LogicalType local_318 [4];
  LogicalType local_2b8;
  string local_2a0;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"regexp_full_match","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  LogicalType::LogicalType(local_318,VARCHAR);
  LogicalType::LogicalType(local_318 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_318;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_330,__l,
             &local_3c1);
  LogicalType::LogicalType(&local_348,BOOLEAN);
  local_398.super__Function_base._M_functor._8_8_ = 0;
  local_398.super__Function_base._M_functor._M_unused._M_object =
       RegexpMatchesFunction<duckdb::RegexFullMatch>;
  local_398._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_398.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2b8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  varargs._0_8_ = &local_2b8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_158,&local_330,&local_348,&local_398,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs,CONSISTENT,in_stack_fffffffffffffc38,(bind_lambda_function_t)in_RDI);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024398b0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2b8);
  if (local_398.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_398.super__Function_base._M_manager)
              ((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_348);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_330);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_318[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_318,VARCHAR);
  LogicalType::LogicalType(local_318 + 1,VARCHAR);
  LogicalType::LogicalType(local_318 + 2,VARCHAR);
  __l_00._M_len = 3;
  __l_00._M_array = local_318;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_360,__l_00,
             &local_3c1);
  LogicalType::LogicalType(&local_378,BOOLEAN);
  local_3b8.super__Function_base._M_functor._8_8_ = 0;
  local_3b8.super__Function_base._M_functor._M_unused._M_object =
       RegexpMatchesFunction<duckdb::RegexFullMatch>;
  local_3b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_318 + 3,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  varargs_00._0_8_ = local_318 + 3;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_280,&local_360,&local_378,&local_3b8,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs_00,CONSISTENT,in_stack_fffffffffffffc38,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024398b0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(local_318 + 3);
  if (local_3b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3b8.super__Function_base._M_manager)
              ((_Any_data *)&local_3b8,(_Any_data *)&local_3b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_378);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_360);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_318[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunctionSet RegexpFun::GetFunctions() {
	ScalarFunctionSet regexp_full_match("regexp_full_match");
	regexp_full_match.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	                   RegexpMatchesFunction<RegexFullMatch>, RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState,
	                   LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	regexp_full_match.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	                   RegexpMatchesFunction<RegexFullMatch>, RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState,
	                   LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	return (regexp_full_match);
}